

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

int __thiscall cmake::Generate(cmake *this)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  int iVar4;
  allocator local_39;
  string local_38;
  
  iVar4 = -1;
  if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
    bVar1 = cmGlobalGenerator::Compute(this->GlobalGenerator);
    if (bVar1) {
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0xb])();
      if ((this->GraphVizFile)._M_string_length != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Generate graphviz: ",0x13);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(this->GraphVizFile)._M_dataplus._M_p,
                            (this->GraphVizFile)._M_string_length);
        std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        GenerateGraphViz(this,(this->GraphVizFile)._M_dataplus._M_p);
      }
      if (this->WarnUnusedCli == true) {
        RunCheckForUnusedVariables(this);
      }
      if ((cmSystemTools::s_ErrorOccured == false) && (cmSystemTools::s_FatalErrorOccured == false))
      {
        bVar1 = cmSystemTools::GetInterruptFlag();
        if (!bVar1) {
          iVar4 = 0;
          if (this->CurrentWorkingMode == NORMAL_MODE) {
            pcVar3 = cmState::GetBinaryDirectory(this->State);
            std::__cxx11::string::string((string *)&local_38,pcVar3,&local_39);
            SaveCache(this,&local_38);
            iVar4 = 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_38._M_dataplus._M_p != &local_38.field_2) {
              operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
            }
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int cmake::Generate()
{
  if (!this->GlobalGenerator) {
    return -1;
  }
  if (!this->GlobalGenerator->Compute()) {
    return -1;
  }
  this->GlobalGenerator->Generate();
  if (!this->GraphVizFile.empty()) {
    std::cout << "Generate graphviz: " << this->GraphVizFile << std::endl;
    this->GenerateGraphViz(this->GraphVizFile.c_str());
  }
  if (this->WarnUnusedCli) {
    this->RunCheckForUnusedVariables();
  }
  if (cmSystemTools::GetErrorOccuredFlag()) {
    return -1;
  }
  // Save the cache again after a successful Generate so that any internal
  // variables created during Generate are saved. (Specifically target GUIDs
  // for the Visual Studio and Xcode generators.)
  if (this->GetWorkingMode() == NORMAL_MODE) {
    this->SaveCache(this->GetHomeOutputDirectory());
  }
  return 0;
}